

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O0

int envy_bios_parse_power_unk24(envy_bios *bios)

{
  int iVar1;
  int iVar2;
  int iVar3;
  envy_bios_power_unk24 *peVar4;
  envy_bios_power_unk24_entry *peVar5;
  uint32_t data;
  int err;
  int i;
  envy_bios_power_unk24 *unk24;
  envy_bios *bios_local;
  
  peVar4 = &(bios->power).unk24;
  if (peVar4->offset == 0) {
    bios_local._4_4_ = -0x16;
  }
  else {
    bios_u8(bios,peVar4->offset,&(bios->power).unk24.version);
    if ((bios->power).unk24.version == '\x10') {
      iVar1 = bios_u8(bios,peVar4->offset + 1,&(bios->power).unk24.hlen);
      iVar2 = bios_u8(bios,peVar4->offset + 2,&(bios->power).unk24.rlen);
      iVar3 = bios_u8(bios,peVar4->offset + 3,&(bios->power).unk24.entriesnum);
      (bios->power).unk24.valid = ((iVar3 != 0 || (iVar2 != 0 || iVar1 != 0)) ^ 0xffU) & 1;
      peVar5 = (envy_bios_power_unk24_entry *)malloc((ulong)(bios->power).unk24.entriesnum << 2);
      (bios->power).unk24.entries = peVar5;
      for (data = 0; (int)data < (int)(uint)(bios->power).unk24.entriesnum; data = data + 1) {
        (bios->power).unk24.entries[(int)data].offset =
             peVar4->offset + (uint)(bios->power).unk24.hlen + data * (bios->power).unk24.rlen;
      }
      bios_local._4_4_ = 0;
    }
    else {
      fprintf(_stderr,"Unknown VENTURA table version 0x%x\n",(ulong)(bios->power).unk24.version);
      bios_local._4_4_ = -0x16;
    }
  }
  return bios_local._4_4_;
}

Assistant:

int envy_bios_parse_power_unk24(struct envy_bios *bios) {
	struct envy_bios_power_unk24 *unk24 = &bios->power.unk24;
	int i, err = 0;

	if (!unk24->offset)
		return -EINVAL;

	bios_u8(bios, unk24->offset + 0x0, &unk24->version);
	switch(unk24->version) {
	case 0x10:
		err |= bios_u8(bios, unk24->offset + 0x1, &unk24->hlen);
		err |= bios_u8(bios, unk24->offset + 0x2, &unk24->rlen);
		err |= bios_u8(bios, unk24->offset + 0x3, &unk24->entriesnum);
		unk24->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown VENTURA table version 0x%x\n", unk24->version);
		return -EINVAL;
	};

	err = 0;
	unk24->entries = malloc(unk24->entriesnum * sizeof(struct envy_bios_power_unk24_entry));
	for (i = 0; i < unk24->entriesnum; i++) {
		uint32_t data = unk24->offset + unk24->hlen + i * unk24->rlen;

		unk24->entries[i].offset = data;
	}

	return 0;
}